

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

void __thiscall
benchmark::internal::BenchmarkImp::RangePair(BenchmarkImp *this,int lo1,int hi1,int lo2,int hi2)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  int j;
  int i;
  vector<int,_std::allocator<int>_> arglist2;
  vector<int,_std::allocator<int>_> arglist1;
  int local_80;
  int local_7c;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_58;
  pointer local_38;
  
  if ((this->arg_count_ != 2) && (this->arg_count_ != -1)) {
    CheckHandler::CheckHandler
              ((CheckHandler *)&local_58,"arg_count_ == -1 || arg_count_ == 2",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
               ,"RangePair",0x1c2);
    CheckHandler::~CheckHandler((CheckHandler *)&local_58);
  }
  GetNullLogInstance();
  this->arg_count_ = 2;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  AddRange(&local_58,lo1,hi1,8);
  AddRange(&local_78,lo2,hi2,8);
  local_38 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar3 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      piVar1 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_7c = *piVar3;
      for (piVar2 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
        local_80 = *piVar2;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->args_,
                   &local_7c,&local_80);
      }
      piVar3 = piVar3 + 1;
    } while (piVar3 != local_38);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BenchmarkImp::RangePair(int lo1, int hi1, int lo2, int hi2) {
  CHECK(arg_count_ == -1 || arg_count_ == 2);
  arg_count_ = 2;
  std::vector<int> arglist1, arglist2;
  AddRange(&arglist1, lo1, hi1, kRangeMultiplier);
  AddRange(&arglist2, lo2, hi2, kRangeMultiplier);

  for (int i : arglist1) {
    for (int j : arglist2) {
      args_.emplace_back(i, j);
    }
  }
}